

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_reader.cpp
# Opt level: O0

void __thiscall diffusion::Tokenizer::push(Tokenizer *this,string *raw_data)

{
  int iVar1;
  int *piVar2;
  ErrorDataCorruption *this_00;
  ulong uVar3;
  char *data;
  vector<char,_std::allocator<char>_> local_50;
  lock_guard<std::mutex> local_38;
  lock_guard<std::mutex> lock;
  Size message_length;
  string *raw_data_local;
  Tokenizer *this_local;
  
  std::__cxx11::string::operator+=((string *)this,(string *)raw_data);
  piVar2 = (int *)std::__cxx11::string::operator[]((ulong)this);
  iVar1 = *piVar2;
  std::__cxx11::string::erase((ulong)this,0);
  if (-1 < iVar1) {
    uVar3 = std::__cxx11::string::size();
    if ((ulong)(long)iVar1 <= uVar3) {
      std::lock_guard<std::mutex>::lock_guard(&local_38,&this->queue_mutex_);
      data = (char *)std::__cxx11::string::operator[]((ulong)this);
      to_vector_char(&local_50,data,(long)iVar1);
      std::
      deque<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::push_back(&this->processed_data_queue_,&local_50);
      std::vector<char,_std::allocator<char>_>::~vector(&local_50);
      std::__cxx11::string::erase((ulong)this,0);
      std::lock_guard<std::mutex>::~lock_guard(&local_38);
    }
    return;
  }
  this_00 = (ErrorDataCorruption *)__cxa_allocate_exception(0x10);
  ErrorDataCorruption::ErrorDataCorruption(this_00);
  __cxa_throw(this_00,&ErrorDataCorruption::typeinfo,ErrorDataCorruption::~ErrorDataCorruption);
}

Assistant:

void push(std::string const & raw_data) {
        unprocessed_data_ += raw_data;
        auto message_length = *reinterpret_cast<Size *>(&unprocessed_data_[0]);
        unprocessed_data_.erase(0, sizeof(Size));
        if (message_length < 0)
            throw ErrorDataCorruption();
        if (static_cast<std::size_t>(message_length) > unprocessed_data_.size()) {
        } else {
            std::lock_guard<std::mutex> lock(queue_mutex_);
            processed_data_queue_.push_back(to_vector_char(&unprocessed_data_[0], message_length));
            unprocessed_data_.erase(0, message_length);
        }
    }